

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

uint32 __thiscall
Js::RecyclableArrayWalker::GetItemCount(RecyclableArrayWalker *this,JavascriptArray *arrayObj)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  ArenaAllocator *alloc;
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar6;
  uint *puVar7;
  uint local_24;
  uint local_20;
  uint32 absIndex;
  uint32 descriptorIndex;
  uint32 dataIndex;
  JavascriptArray *arrayObj_local;
  RecyclableArrayWalker *this_local;
  
  _descriptorIndex = arrayObj;
  arrayObj_local = (JavascriptArray *)this;
  if (this->pAbsoluteIndexList ==
      (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
      0x0) {
    if (arrayObj == (JavascriptArray *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xb2f,"(arrayObj)","arrayObj");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    alloc = GetArenaFromContext((this->super_RecyclableObjectWalker).scriptContext);
    pLVar6 = JsUtil::
             List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::New(alloc,4);
    this->pAbsoluteIndexList = pLVar6;
    if (this->pAbsoluteIndexList ==
        (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
        0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xb32,"(pAbsoluteIndexList)","pAbsoluteIndexList");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    absIndex = 0xffffffff;
    local_20 = 0xffffffff;
    local_24 = 0xffffffff;
    do {
      if (local_24 == absIndex) {
        absIndex = Js::JavascriptArray::GetNextIndex(_descriptorIndex,absIndex);
      }
      if (local_24 == local_20) {
        local_20 = (*(this->super_RecyclableObjectWalker).super_IDiagObjectModelWalkerBase.
                     _vptr_IDiagObjectModelWalkerBase[4])(this,(ulong)local_20);
      }
      puVar7 = min<unsigned_int>(&absIndex,&local_20);
      uVar1 = *puVar7;
      local_24 = uVar1;
      if ((uVar1 == 0xffffffff) ||
         (uVar4 = ArrayObject::GetLength(&_descriptorIndex->super_ArrayObject), uVar4 <= uVar1))
      break;
      JsUtil::
      List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
                (this->pAbsoluteIndexList,&local_24);
      uVar1 = local_24;
      uVar4 = ArrayObject::GetLength(&_descriptorIndex->super_ArrayObject);
    } while (uVar1 < uVar4);
  }
  uVar4 = JsUtil::ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>::Count
                    (&this->pAbsoluteIndexList->
                      super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>);
  return uVar4;
}

Assistant:

uint32 RecyclableArrayWalker::GetItemCount(Js::JavascriptArray* arrayObj)
    {
        if (pAbsoluteIndexList == nullptr)
        {
            Assert(arrayObj);

            pAbsoluteIndexList = JsUtil::List<uint32, ArenaAllocator>::New(GetArenaFromContext(scriptContext));
            Assert(pAbsoluteIndexList);

            uint32 dataIndex = Js::JavascriptArray::InvalidIndex;
            uint32 descriptorIndex = Js::JavascriptArray::InvalidIndex;
            uint32 absIndex = Js::JavascriptArray::InvalidIndex;

            do
            {
                if (absIndex == dataIndex)
                {
                    dataIndex = arrayObj->GetNextIndex(dataIndex);
                }
                if (absIndex == descriptorIndex)
                {
                    descriptorIndex = GetNextDescriptor(descriptorIndex);
                }

                absIndex = min(dataIndex, descriptorIndex);

                if (absIndex == Js::JavascriptArray::InvalidIndex || absIndex >= arrayObj->GetLength())
                {
                    break;
                }

                pAbsoluteIndexList->Add(absIndex);

            } while (absIndex < arrayObj->GetLength());
        }

        return (uint32)pAbsoluteIndexList->Count();
    }